

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_importInvalidComponentFromCellmlModelComponentError_Test::TestBody
          (Importer_importInvalidComponentFromCellmlModelComponentError_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertHelper local_258 [8];
  Message local_250 [8];
  shared_ptr<libcellml::Issue> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_1;
  Message local_200 [8];
  unsigned_long local_1f8 [2];
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  string local_1d0 [32];
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [32];
  shared_ptr<libcellml::Component> local_168;
  allocator<char> local_151;
  string local_150 [32];
  shared_ptr<libcellml::Component> local_130;
  allocator<char> local_119;
  string local_118 [32];
  string local_f8 [32];
  undefined1 local_d8 [8];
  ModelPtr model;
  ParserPtr parser;
  ImporterPtr importer;
  allocator<char> local_91;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> e;
  Importer_importInvalidComponentFromCellmlModelComponentError_Test *this_local;
  
  e.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,"importer/invalid_model.cellml",&local_91);
  resourcePath((string *)&local_70);
  std::operator+(&local_50,
                 "Encountered an error when resolving component \'component1_imported\' from \'",
                 &local_70);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &local_50,"\'.");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  libcellml::Importer::create((bool)((char)&parser + '\b'));
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"importer/import_invalid_component.cellml",&local_119);
  fileContents(local_f8);
  libcellml::Parser::parseModel((string *)local_d8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_d8);
  libcellml::ComponentEntity::component((ulong)&local_130);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"component1",&local_151);
  libcellml::ImportedEntity::setImportReference((string *)(peVar2 + 0x10));
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_130);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_d8);
  libcellml::ComponentEntity::component((ulong)&local_168);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"component1_imported",&local_189);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_168);
  peVar3 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d0,"importer",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  resourcePath(local_1b0);
  libcellml::Importer::resolveImports((shared_ptr *)peVar3,(string *)local_d8);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_1f8[1] = 1;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_1f8[0] = libcellml::Logger::errorCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1e8,"size_t(1)","importer->errorCount()",local_1f8 + 1,
             local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(local_200);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x4eb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::error((ulong)&local_248);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_248);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_218,"e","importer->error(0)->description()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             &local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(local_250);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              (local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x4ec,pcVar4);
    testing::internal::AssertHelper::operator=(local_258,local_250);
    testing::internal::AssertHelper::~AssertHelper(local_258);
    testing::Message::~Message(local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_d8);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Importer>::~shared_ptr
            ((shared_ptr<libcellml::Importer> *)
             &parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(Importer, importInvalidComponentFromCellmlModelComponentError)
{
    auto e = "Encountered an error when resolving component 'component1_imported' from '" + resourcePath("importer/invalid_model.cellml") + "'.";

    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();

    auto model = parser->parseModel(fileContents("importer/import_invalid_component.cellml"));
    model->component(0)->setImportReference("component1");
    model->component(0)->setName("component1_imported");

    importer->resolveImports(model, resourcePath("importer"));
    EXPECT_EQ(size_t(1), importer->errorCount());
    EXPECT_EQ(e, importer->error(0)->description());
}